

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

ui_event inkey_aux(wchar_t scan_cutoff)

{
  errr eVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  ui_event uVar3;
  undefined1 local_28 [8];
  ui_event ke;
  wchar_t w;
  wchar_t scan_cutoff_local;
  ui_event empty;
  
  ke.key.code = 0;
  ke._8_4_ = scan_cutoff;
  if (scan_cutoff == L'\0') {
    Term_inkey((ui_event *)local_28,true,true);
    uVar2 = extraout_RDX;
  }
  else {
    ke.key.code = 0;
    while( true ) {
      eVar1 = Term_inkey((ui_event *)local_28,false,true);
      uVar2 = extraout_RDX_00;
      if (eVar1 == 0) break;
      ke.key.code = ke.key.code + 1;
      if ((int)ke._8_4_ <= (int)ke.key.code) {
        w = EVT_NONE;
        scan_cutoff_local._0_1_ = '\0';
        scan_cutoff_local._1_1_ = '\0';
        scan_cutoff_local._2_1_ = '\0';
        scan_cutoff_local._3_1_ = '\0';
        empty.type._0_1_ = 0;
        goto LAB_0024b44e;
      }
      Term_xtra(L'\r',L'\n');
    }
  }
  w = local_28._0_4_;
  scan_cutoff_local._0_1_ = local_28[4];
  scan_cutoff_local._1_1_ = local_28[5];
  scan_cutoff_local._2_1_ = local_28[6];
  scan_cutoff_local._3_1_ = local_28[7];
  empty.type._0_1_ = ke.type._0_1_;
LAB_0024b44e:
  uVar3._8_4_ = (undefined4)CONCAT71((int7)((ulong)uVar2 >> 8),empty.type._0_1_);
  uVar3.mouse = _w;
  return uVar3;
}

Assistant:

static ui_event inkey_aux(int scan_cutoff)
{
	int w = 0;	

	ui_event ke;
	
	/* Wait for a keypress */
	if (scan_cutoff == SCAN_OFF) {
		(void)(Term_inkey(&ke, true, true));
	} else {
		w = 0;

		/* Wait only as long as macro activation would wait */
		while (Term_inkey(&ke, false, true) != 0) {
			/* Increase "wait" */
			w++;

			/* Excessive delay */
			if (w >= scan_cutoff) {
				ui_event empty = EVENT_EMPTY;
				return empty;
			}

			/* Delay */
			Term_xtra(TERM_XTRA_DELAY, 10);
		}
	}

	return (ke);
}